

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O0

inform_dist * inform_dist_realloc(inform_dist *dist,size_t n)

{
  uint32_t *puVar1;
  ulong local_38;
  size_t i_1;
  size_t i;
  uint32_t *histogram;
  size_t n_local;
  inform_dist *dist_local;
  
  dist_local = dist;
  if (n != 0) {
    n_local = (size_t)dist;
    if ((dist == (inform_dist *)0x0) || (dist->size == n)) {
      if (dist == (inform_dist *)0x0) {
        n_local = (size_t)inform_dist_alloc(n);
      }
    }
    else {
      puVar1 = (uint32_t *)realloc(dist->histogram,n << 2);
      if (puVar1 == (uint32_t *)0x0) {
        return (inform_dist *)0x0;
      }
      dist->histogram = puVar1;
      if (n < dist->size) {
        dist->size = n;
        dist->counts = 0;
        for (i_1 = 0; i_1 < dist->size; i_1 = i_1 + 1) {
          dist->counts = (ulong)dist->histogram[i_1] + dist->counts;
        }
      }
      else {
        for (local_38 = dist->size; local_38 < n; local_38 = local_38 + 1) {
          dist->histogram[local_38] = 0;
        }
        dist->size = n;
      }
    }
    dist_local = (inform_dist *)n_local;
  }
  return dist_local;
}

Assistant:

inform_dist* inform_dist_realloc(inform_dist *dist, size_t n)
{
    // if the requested size is zero, return the original distribution
    if (n == 0)
    {
        return dist;
    }
    // if the distribution is not NULL and the requested size is different
    // from the current size
    if (dist != NULL && dist->size != n)
    {
        // realloc the histogram
        uint32_t *histogram = realloc(dist->histogram, n * sizeof(uint32_t));
        // if the reallocation succeeded
        if (histogram != NULL)
        {
            // reset the distribution's histogram to the new histogram
            dist->histogram = histogram;
            // if the histogram was shrunken
            if (n < dist->size)
            {
                // set the new distribution size
                dist->size = n;
                // sum up the counts that are in the smaller support
                dist->counts = 0;
                for (size_t i = 0; i < dist->size; ++i)
                {
                    dist->counts += dist->histogram[i];
                }
            }
            // otherwise
            else
            {
                // zero out all of the newly observable events
                for (size_t i = dist->size; i < n; ++i)
                {
                    dist->histogram[i] = 0;
                }
                // set the size of the distribution
                dist->size = n;
            }
        }
        // otherwise
        else
        {
            // return NULL leaving the original distribution unscathed
            return NULL;
        }
    }
    // if the original distribution was NULL
    else if (dist == NULL)
    {
        // simply allocate the a new distribution of the requested size
        dist = inform_dist_alloc(n);
    }
    // return the (potentially NULL) distribution
    return dist;
}